

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O3

void ZXing::SaveAsPBM(BitMatrix *matrix,string *filename,int quietZone)

{
  ostream *poVar1;
  Matrix<unsigned_char> out;
  ofstream file;
  Matrix<unsigned_char> local_250;
  BitMatrix local_230;
  undefined1 local_210 [8];
  pointer local_208;
  pointer local_1f8;
  ios_base local_118 [264];
  
  local_230._width = matrix->_width;
  local_230._height = matrix->_height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_230._bits,&matrix->_bits);
  Inflate((BitMatrix *)local_210,&local_230,0,0,quietZone);
  ToMatrix<unsigned_char>(&local_250,(BitMatrix *)local_210,'\0',0xff);
  if (local_208 != (pointer)0x0) {
    operator_delete(local_208,(long)local_1f8 - (long)local_208);
  }
  if (local_230._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230._bits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_230._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::ofstream::ofstream(local_210,(string *)filename,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_210,"P5\n",3);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_210,local_250._width);
  local_230._width._0_1_ = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_230,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_250._height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n255\n",5);
  std::ostream::write(local_210,
                      (long)local_250._data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  local_210 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18)) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&local_208);
  std::ios_base::~ios_base(local_118);
  if (local_250._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SaveAsPBM(const BitMatrix& matrix, const std::string filename, int quietZone)
{
	auto out = ToMatrix<uint8_t>(Inflate(matrix.copy(), 0, 0, quietZone));
	std::ofstream file(filename);
	file << "P5\n" << out.width() << ' ' << out.height() << "\n255\n";
	file.write(reinterpret_cast<const char*>(out.data()), out.size());
}